

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O1

int __thiscall protozero::pbf_reader::get_svarint<int>(pbf_reader *this)

{
  char *pcVar1;
  uint64_t val;
  ulong uVar2;
  assert_error *this_00;
  
  if ((this->m_wire_type & ~length_delimited) == varint) {
    pcVar1 = this->m_data;
    if ((pcVar1 == this->m_end) || (uVar2 = (ulong)*pcVar1, (long)uVar2 < 0)) {
      uVar2 = detail::decode_varint_impl(&this->m_data,this->m_end);
    }
    else {
      this->m_data = pcVar1 + 1;
    }
    return (uint)(uVar2 >> 1) ^ -((uint)uVar2 & 1);
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error
            (this_00,
             "(has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && \"not a varint\""
            );
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get_svarint() {
        protozero_assert((has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && "not a varint");
        return static_cast<T>(decode_zigzag64(decode_varint(&m_data, m_end)));
    }